

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O3

void __thiscall embree::BVH4Factory::selectIntersectors(BVH4Factory *this,int features)

{
  code *pcVar1;
  code *pcVar2;
  code *pcVar3;
  code *pcVar4;
  code *pcVar5;
  code *pcVar6;
  code *pcVar7;
  code *pcVar8;
  code *pcVar9;
  code *pcVar10;
  code *pcVar11;
  code *pcVar12;
  uint uVar13;
  code *pcVar14;
  code *pcVar15;
  code *pcVar16;
  code *pcVar17;
  code *pcVar18;
  bool bVar19;
  BVH4GridIntersector4HybridPlueckerFunc local_2f8;
  BVH4InstanceArrayMBIntersector4ChunkFunc local_2f0;
  BVH4GridIntersector4HybridMoellerFunc local_2e8;
  BVH4InstanceArrayIntersector4ChunkFunc local_2e0;
  BVH4InstanceIntersector4ChunkFunc local_2d8;
  BVH4VirtualIntersector4ChunkFunc local_2d0;
  BVH4SubdivPatch1Intersector4Func local_2c8;
  BVH4Triangle4iMBIntersector4HybridPlueckerFunc local_2c0;
  BVH4InstanceMBIntersector1Func local_2b8;
  BVH4Quad4vIntersector4HybridMoellerNoFilterFunc local_2b0;
  BVH4Triangle4iIntersector4HybridPlueckerFunc local_2a8;
  BVH4GridIntersector1PlueckerFunc local_2a0;
  BVH4SubdivPatch1Intersector1Func local_298;
  BVH4Quad4iMBIntersector4HybridMoellerFunc local_290;
  BVH4GridMBIntersector1MoellerFunc local_288;
  BVH4Quad4vIntersector4HybridPlueckerFunc local_280;
  BVH4InstanceArrayIntersector1Func local_278;
  BVH4Quad4iIntersector4HybridMoellerFunc local_270;
  BVH4VirtualMBIntersector1Func local_268;
  BVH4Triangle4Intersector4HybridMoellerNoFilterFunc local_260;
  BVH4Triangle4vMBIntersector4HybridPlueckerFunc local_258;
  BVH4SubdivPatch1MBIntersector1Func local_250;
  BVH4Triangle4iMBIntersector4HybridMoellerFunc local_248;
  BVH4Triangle4Intersector4HybridMoellerFunc local_240;
  BVH4Triangle4vMBIntersector4HybridMoellerFunc local_238;
  BVH4GridIntersector1MoellerFunc local_230;
  BVH4Triangle4vMBIntersector1MoellerFunc local_228;
  BVH4InstanceArrayMBIntersector1Func local_220;
  BVH4Triangle4iMBIntersector1MoellerFunc local_218;
  BVH4Triangle4iIntersector4HybridMoellerFunc local_210;
  BVH4Quad4vIntersector1MoellerFunc local_208;
  BVH4Quad4iIntersector1MoellerFunc local_200;
  BVH4InstanceIntersector1Func local_1f8;
  BVH4Quad4vIntersector1PlueckerFunc local_1f0;
  BVH4VirtualIntersector1Func local_1e8;
  BVH4Quad4iIntersector1PlueckerFunc local_1e0;
  BVH4Quad4iMBIntersector1PlueckerFunc local_1d8;
  BVH4Quad4iMBIntersector1MoellerFunc local_1d0;
  BVH4Quad4vIntersector4HybridMoellerFunc local_1c8;
  BVH4InstanceArrayMBIntersector8ChunkFunc local_1b0;
  BVH4InstanceArrayIntersector8ChunkFunc local_1a8;
  BVH4InstanceMBIntersector8ChunkFunc local_1a0;
  BVH4InstanceIntersector8ChunkFunc local_198;
  BVH4VirtualMBIntersector8ChunkFunc local_190;
  VirtualCurveIntersector4vFunc local_188;
  BVH4GridIntersector8HybridPlueckerFunc local_180;
  BVH4VirtualIntersector8ChunkFunc local_178;
  BVH4SubdivPatch1MBIntersector8Func local_170;
  BVH4SubdivPatch1Intersector8Func local_168;
  BVH4Quad4iMBIntersector8HybridPlueckerFunc local_160;
  BVH4Quad4iMBIntersector8HybridMoellerFunc local_158;
  BVH4Quad4iIntersector8HybridPlueckerFunc local_150;
  BVH4Quad4vIntersector8HybridPlueckerFunc local_148;
  BVH4Quad4iIntersector8HybridMoellerFunc local_140;
  BVH4Quad4vIntersector8HybridMoellerNoFilterFunc local_138;
  BVH4Quad4vIntersector8HybridMoellerFunc local_130;
  BVH4Triangle4iMBIntersector8HybridPlueckerFunc local_128;
  BVH4Triangle4vMBIntersector8HybridPlueckerFunc local_120;
  BVH4Triangle4iMBIntersector8HybridMoellerFunc local_118;
  BVH4Triangle4vMBIntersector8HybridMoellerFunc local_110;
  BVH4Triangle4iIntersector8HybridPlueckerFunc local_108;
  BVH4Triangle4vIntersector8HybridPlueckerFunc local_100;
  BVH4Triangle4iIntersector8HybridMoellerFunc local_f8;
  BVH4Triangle4Intersector8HybridMoellerNoFilterFunc local_f0;
  BVH4Triangle4Intersector8HybridMoellerFunc local_e8;
  BVH4OBBVirtualCurveIntersectorRobust8HybridMBFunc local_e0;
  BVH4OBBVirtualCurveIntersectorRobust8HybridFunc local_d8;
  BVH4OBBVirtualCurveIntersector8HybridMBFunc local_d0;
  BVH4Triangle4Intersector1MoellerFunc local_c8;
  BVH4OBBVirtualCurveIntersectorRobust4HybridMBFunc local_c0;
  BVH4OBBVirtualCurveIntersectorRobust1MBFunc local_b8;
  BVH4OBBVirtualCurveIntersectorRobust4HybridFunc local_b0;
  BVH4OBBVirtualCurveIntersectorRobust1Func local_a8;
  BVH4OBBVirtualCurveIntersector4HybridMBFunc local_a0;
  BVH4OBBVirtualCurveIntersector1MBFunc local_98;
  BVH4OBBVirtualCurveIntersector4HybridFunc local_90;
  BVH4OBBVirtualCurveIntersector1Func local_88;
  VirtualCurveIntersector8iMBFunc local_80;
  VirtualCurveIntersector4iMBFunc local_78;
  VirtualCurveIntersector8vFunc local_70;
  BVH4Triangle4vMBIntersector1PlueckerFunc local_68;
  BVH4Triangle4iMBIntersector1PlueckerFunc local_60;
  
  uVar13 = ~features;
  bVar19 = (uVar13 & 0x200007f) == 0;
  pcVar16 = sse2::BVH4Triangle4iIntersector1Moeller;
  if (bVar19) {
    pcVar16 = sse42::BVH4Triangle4iIntersector1Moeller;
  }
  pcVar12 = sse2::BVH4Triangle4vIntersector1Pluecker;
  if (bVar19) {
    pcVar12 = sse42::BVH4Triangle4vIntersector1Pluecker;
  }
  pcVar11 = sse2::BVH4Triangle4iIntersector1Pluecker;
  if (bVar19) {
    pcVar11 = sse42::BVH4Triangle4iIntersector1Pluecker;
  }
  local_228 = sse2::BVH4Triangle4vMBIntersector1Moeller;
  if (bVar19) {
    local_228 = sse42::BVH4Triangle4vMBIntersector1Moeller;
  }
  local_218 = sse2::BVH4Triangle4iMBIntersector1Moeller;
  if (bVar19) {
    local_218 = sse42::BVH4Triangle4iMBIntersector1Moeller;
  }
  local_68 = sse2::BVH4Triangle4vMBIntersector1Pluecker;
  if (bVar19) {
    local_68 = sse42::BVH4Triangle4vMBIntersector1Pluecker;
  }
  local_60 = sse2::BVH4Triangle4iMBIntersector1Pluecker;
  if (bVar19) {
    local_60 = sse42::BVH4Triangle4iMBIntersector1Pluecker;
  }
  local_208 = sse2::BVH4Quad4vIntersector1Moeller;
  if (bVar19) {
    local_208 = sse42::BVH4Quad4vIntersector1Moeller;
  }
  local_200 = sse2::BVH4Quad4iIntersector1Moeller;
  if (bVar19) {
    local_200 = sse42::BVH4Quad4iIntersector1Moeller;
  }
  local_1f0 = sse2::BVH4Quad4vIntersector1Pluecker;
  if (bVar19) {
    local_1f0 = sse42::BVH4Quad4vIntersector1Pluecker;
  }
  local_1e0 = sse2::BVH4Quad4iIntersector1Pluecker;
  if (bVar19) {
    local_1e0 = sse42::BVH4Quad4iIntersector1Pluecker;
  }
  local_1d8 = sse2::BVH4Quad4iMBIntersector1Pluecker;
  if (bVar19) {
    local_1d8 = sse42::BVH4Quad4iMBIntersector1Pluecker;
  }
  local_1d0 = sse2::BVH4Quad4iMBIntersector1Moeller;
  if (bVar19) {
    local_1d0 = sse42::BVH4Quad4iMBIntersector1Moeller;
  }
  pcVar2 = sse2::QBVH4Triangle4iIntersector1Pluecker;
  if (bVar19) {
    pcVar2 = sse42::QBVH4Triangle4iIntersector1Pluecker;
  }
  pcVar3 = sse2::QBVH4Quad4iIntersector1Pluecker;
  if (bVar19) {
    pcVar3 = sse42::QBVH4Quad4iIntersector1Pluecker;
  }
  local_298 = sse2::BVH4SubdivPatch1Intersector1;
  if (bVar19) {
    local_298 = sse42::BVH4SubdivPatch1Intersector1;
  }
  local_250 = sse2::BVH4SubdivPatch1MBIntersector1;
  if (bVar19) {
    local_250 = sse42::BVH4SubdivPatch1MBIntersector1;
  }
  local_1e8 = sse2::BVH4VirtualIntersector1;
  if (bVar19) {
    local_1e8 = sse42::BVH4VirtualIntersector1;
  }
  local_268 = sse2::BVH4VirtualMBIntersector1;
  if (bVar19) {
    local_268 = sse42::BVH4VirtualMBIntersector1;
  }
  local_1f8 = sse2::BVH4InstanceIntersector1;
  if (bVar19) {
    local_1f8 = sse42::BVH4InstanceIntersector1;
  }
  local_2b8 = sse2::BVH4InstanceMBIntersector1;
  if (bVar19) {
    local_2b8 = sse42::BVH4InstanceMBIntersector1;
  }
  local_278 = sse2::BVH4InstanceArrayIntersector1;
  if (bVar19) {
    local_278 = sse42::BVH4InstanceArrayIntersector1;
  }
  local_220 = sse2::BVH4InstanceArrayMBIntersector1;
  if (bVar19) {
    local_220 = sse42::BVH4InstanceArrayMBIntersector1;
  }
  local_230 = sse2::BVH4GridIntersector1Moeller;
  if (bVar19) {
    local_230 = sse42::BVH4GridIntersector1Moeller;
  }
  local_288 = sse2::BVH4GridMBIntersector1Moeller;
  if (bVar19) {
    local_288 = sse42::BVH4GridMBIntersector1Moeller;
  }
  local_2a0 = sse2::BVH4GridIntersector1Pluecker;
  if (bVar19) {
    local_2a0 = sse42::BVH4GridIntersector1Pluecker;
  }
  local_240 = sse2::BVH4Triangle4Intersector4HybridMoeller;
  if (bVar19) {
    local_240 = sse42::BVH4Triangle4Intersector4HybridMoeller;
  }
  local_260 = sse2::BVH4Triangle4Intersector4HybridMoellerNoFilter;
  if (bVar19) {
    local_260 = sse42::BVH4Triangle4Intersector4HybridMoellerNoFilter;
  }
  local_210 = sse2::BVH4Triangle4iIntersector4HybridMoeller;
  if (bVar19) {
    local_210 = sse42::BVH4Triangle4iIntersector4HybridMoeller;
  }
  pcVar4 = sse2::BVH4Triangle4vIntersector4HybridPluecker;
  if (bVar19) {
    pcVar4 = sse42::BVH4Triangle4vIntersector4HybridPluecker;
  }
  local_2a8 = sse2::BVH4Triangle4iIntersector4HybridPluecker;
  if (bVar19) {
    local_2a8 = sse42::BVH4Triangle4iIntersector4HybridPluecker;
  }
  local_238 = sse2::BVH4Triangle4vMBIntersector4HybridMoeller;
  if (bVar19) {
    local_238 = sse42::BVH4Triangle4vMBIntersector4HybridMoeller;
  }
  local_248 = sse2::BVH4Triangle4iMBIntersector4HybridMoeller;
  if (bVar19) {
    local_248 = sse42::BVH4Triangle4iMBIntersector4HybridMoeller;
  }
  local_258 = sse2::BVH4Triangle4vMBIntersector4HybridPluecker;
  if (bVar19) {
    local_258 = sse42::BVH4Triangle4vMBIntersector4HybridPluecker;
  }
  local_2c0 = sse2::BVH4Triangle4iMBIntersector4HybridPluecker;
  if (bVar19) {
    local_2c0 = sse42::BVH4Triangle4iMBIntersector4HybridPluecker;
  }
  local_1c8 = sse2::BVH4Quad4vIntersector4HybridMoeller;
  if (bVar19) {
    local_1c8 = sse42::BVH4Quad4vIntersector4HybridMoeller;
  }
  local_2b0 = sse2::BVH4Quad4vIntersector4HybridMoellerNoFilter;
  if (bVar19) {
    local_2b0 = sse42::BVH4Quad4vIntersector4HybridMoellerNoFilter;
  }
  local_270 = sse2::BVH4Quad4iIntersector4HybridMoeller;
  if (bVar19) {
    local_270 = sse42::BVH4Quad4iIntersector4HybridMoeller;
  }
  local_280 = sse2::BVH4Quad4vIntersector4HybridPluecker;
  if (bVar19) {
    local_280 = sse42::BVH4Quad4vIntersector4HybridPluecker;
  }
  pcVar5 = sse2::BVH4Quad4iIntersector4HybridPluecker;
  if (bVar19) {
    pcVar5 = sse42::BVH4Quad4iIntersector4HybridPluecker;
  }
  local_290 = sse2::BVH4Quad4iMBIntersector4HybridMoeller;
  if (bVar19) {
    local_290 = sse42::BVH4Quad4iMBIntersector4HybridMoeller;
  }
  pcVar6 = sse2::BVH4Quad4iMBIntersector4HybridPluecker;
  if (bVar19) {
    pcVar6 = sse42::BVH4Quad4iMBIntersector4HybridPluecker;
  }
  local_2c8 = sse2::BVH4SubdivPatch1Intersector4;
  if (bVar19) {
    local_2c8 = sse42::BVH4SubdivPatch1Intersector4;
  }
  pcVar7 = sse2::BVH4SubdivPatch1MBIntersector4;
  if (bVar19) {
    pcVar7 = sse42::BVH4SubdivPatch1MBIntersector4;
  }
  local_2d0 = sse2::BVH4VirtualIntersector4Chunk;
  if (bVar19) {
    local_2d0 = sse42::BVH4VirtualIntersector4Chunk;
  }
  pcVar8 = sse2::BVH4VirtualMBIntersector4Chunk;
  if (bVar19) {
    pcVar8 = sse42::BVH4VirtualMBIntersector4Chunk;
  }
  local_2d8 = sse2::BVH4InstanceIntersector4Chunk;
  if (bVar19) {
    local_2d8 = sse42::BVH4InstanceIntersector4Chunk;
  }
  pcVar9 = sse2::BVH4InstanceMBIntersector4Chunk;
  if (bVar19) {
    pcVar9 = sse42::BVH4InstanceMBIntersector4Chunk;
  }
  local_2e0 = sse2::BVH4InstanceArrayIntersector4Chunk;
  if (bVar19) {
    local_2e0 = sse42::BVH4InstanceArrayIntersector4Chunk;
  }
  local_2f0 = sse2::BVH4InstanceArrayMBIntersector4Chunk;
  if (bVar19) {
    local_2f0 = sse42::BVH4InstanceArrayMBIntersector4Chunk;
  }
  local_2e8 = sse2::BVH4GridIntersector4HybridMoeller;
  if (bVar19) {
    local_2e8 = sse42::BVH4GridIntersector4HybridMoeller;
  }
  pcVar18 = sse2::BVH4GridMBIntersector4HybridMoeller;
  if (bVar19) {
    pcVar18 = sse42::BVH4GridMBIntersector4HybridMoeller;
  }
  local_2f8 = sse2::BVH4GridIntersector4HybridPluecker;
  if (bVar19) {
    local_2f8 = sse42::BVH4GridIntersector4HybridPluecker;
  }
  bVar19 = (uVar13 & 0x60000ff) == 0;
  pcVar14 = sse2::VirtualCurveIntersector4i;
  if (bVar19) {
    pcVar14 = avx::VirtualCurveIntersector4i;
  }
  pcVar15 = VirtualCurveIntersector8i_error;
  if (bVar19) {
    pcVar15 = avx::VirtualCurveIntersector8i;
  }
  local_188 = sse2::VirtualCurveIntersector4v;
  if (bVar19) {
    local_188 = avx::VirtualCurveIntersector4v;
  }
  local_70 = VirtualCurveIntersector8v_error;
  if (bVar19) {
    local_70 = avx::VirtualCurveIntersector8v;
  }
  local_78 = sse2::VirtualCurveIntersector4iMB;
  if (bVar19) {
    local_78 = avx::VirtualCurveIntersector4iMB;
  }
  local_80 = VirtualCurveIntersector8iMB_error;
  if (bVar19) {
    local_80 = avx::VirtualCurveIntersector8iMB;
  }
  local_88 = sse2::BVH4OBBVirtualCurveIntersector1;
  if (bVar19) {
    local_88 = avx::BVH4OBBVirtualCurveIntersector1;
  }
  local_98 = sse2::BVH4OBBVirtualCurveIntersector1MB;
  if (bVar19) {
    local_98 = avx::BVH4OBBVirtualCurveIntersector1MB;
  }
  local_a8 = sse2::BVH4OBBVirtualCurveIntersectorRobust1;
  if (bVar19) {
    local_a8 = avx::BVH4OBBVirtualCurveIntersectorRobust1;
  }
  local_b8 = sse2::BVH4OBBVirtualCurveIntersectorRobust1MB;
  if (bVar19) {
    local_b8 = avx::BVH4OBBVirtualCurveIntersectorRobust1MB;
  }
  local_c8 = sse2::BVH4Triangle4Intersector1Moeller;
  if (bVar19) {
    local_c8 = avx::BVH4Triangle4Intersector1Moeller;
    pcVar16 = avx::BVH4Triangle4iIntersector1Moeller;
    pcVar12 = avx::BVH4Triangle4vIntersector1Pluecker;
    pcVar11 = avx::BVH4Triangle4iIntersector1Pluecker;
    local_228 = avx::BVH4Triangle4vMBIntersector1Moeller;
    local_218 = avx::BVH4Triangle4iMBIntersector1Moeller;
    local_68 = avx::BVH4Triangle4vMBIntersector1Pluecker;
    local_60 = avx::BVH4Triangle4iMBIntersector1Pluecker;
    local_208 = avx::BVH4Quad4vIntersector1Moeller;
    local_200 = avx::BVH4Quad4iIntersector1Moeller;
    local_1f0 = avx::BVH4Quad4vIntersector1Pluecker;
    local_1e0 = avx::BVH4Quad4iIntersector1Pluecker;
    local_1d8 = avx::BVH4Quad4iMBIntersector1Pluecker;
    local_1d0 = avx::BVH4Quad4iMBIntersector1Moeller;
    pcVar2 = avx::QBVH4Triangle4iIntersector1Pluecker;
    pcVar3 = avx::QBVH4Quad4iIntersector1Pluecker;
    local_298 = avx::BVH4SubdivPatch1Intersector1;
    local_250 = avx::BVH4SubdivPatch1MBIntersector1;
    local_1e8 = avx::BVH4VirtualIntersector1;
    local_268 = avx::BVH4VirtualMBIntersector1;
    local_1f8 = avx::BVH4InstanceIntersector1;
    local_2b8 = avx::BVH4InstanceMBIntersector1;
    local_278 = avx::BVH4InstanceArrayIntersector1;
    local_220 = avx::BVH4InstanceArrayMBIntersector1;
    local_230 = avx::BVH4GridIntersector1Moeller;
    local_288 = avx::BVH4GridMBIntersector1Moeller;
    local_2a0 = avx::BVH4GridIntersector1Pluecker;
  }
  local_90 = sse2::BVH4OBBVirtualCurveIntersector4Hybrid;
  if (bVar19) {
    local_90 = avx::BVH4OBBVirtualCurveIntersector4Hybrid;
  }
  local_a0 = sse2::BVH4OBBVirtualCurveIntersector4HybridMB;
  if (bVar19) {
    local_a0 = avx::BVH4OBBVirtualCurveIntersector4HybridMB;
  }
  local_b0 = sse2::BVH4OBBVirtualCurveIntersectorRobust4Hybrid;
  if (bVar19) {
    local_b0 = avx::BVH4OBBVirtualCurveIntersectorRobust4Hybrid;
  }
  local_c0 = sse2::BVH4OBBVirtualCurveIntersectorRobust4HybridMB;
  if (bVar19) {
    local_c0 = avx::BVH4OBBVirtualCurveIntersectorRobust4HybridMB;
    local_240 = avx::BVH4Triangle4Intersector4HybridMoeller;
    local_260 = avx::BVH4Triangle4Intersector4HybridMoellerNoFilter;
    local_210 = avx::BVH4Triangle4iIntersector4HybridMoeller;
    pcVar4 = avx::BVH4Triangle4vIntersector4HybridPluecker;
    local_2a8 = avx::BVH4Triangle4iIntersector4HybridPluecker;
    local_238 = avx::BVH4Triangle4vMBIntersector4HybridMoeller;
    local_248 = avx::BVH4Triangle4iMBIntersector4HybridMoeller;
    local_258 = avx::BVH4Triangle4vMBIntersector4HybridPluecker;
    local_2c0 = avx::BVH4Triangle4iMBIntersector4HybridPluecker;
    local_1c8 = avx::BVH4Quad4vIntersector4HybridMoeller;
    local_2b0 = avx::BVH4Quad4vIntersector4HybridMoellerNoFilter;
    local_270 = avx::BVH4Quad4iIntersector4HybridMoeller;
    local_280 = avx::BVH4Quad4vIntersector4HybridPluecker;
    pcVar5 = avx::BVH4Quad4iIntersector4HybridPluecker;
    local_290 = avx::BVH4Quad4iMBIntersector4HybridMoeller;
    pcVar6 = avx::BVH4Quad4iMBIntersector4HybridPluecker;
    local_2c8 = avx::BVH4SubdivPatch1Intersector4;
    pcVar7 = avx::BVH4SubdivPatch1MBIntersector4;
    local_2d0 = avx::BVH4VirtualIntersector4Chunk;
    pcVar8 = avx::BVH4VirtualMBIntersector4Chunk;
    local_2d8 = avx::BVH4InstanceIntersector4Chunk;
    pcVar9 = avx::BVH4InstanceMBIntersector4Chunk;
    local_2e0 = avx::BVH4InstanceArrayIntersector4Chunk;
    local_2f0 = avx::BVH4InstanceArrayMBIntersector4Chunk;
    local_2e8 = avx::BVH4GridIntersector4HybridMoeller;
    pcVar18 = avx::BVH4GridMBIntersector4HybridMoeller;
    local_2f8 = avx::BVH4GridIntersector4HybridPluecker;
  }
  pcVar1 = BVH4OBBVirtualCurveIntersector8Hybrid_error;
  if (bVar19) {
    pcVar1 = avx::BVH4OBBVirtualCurveIntersector8Hybrid;
  }
  local_d0 = BVH4OBBVirtualCurveIntersector8HybridMB_error;
  if (bVar19) {
    local_d0 = avx::BVH4OBBVirtualCurveIntersector8HybridMB;
  }
  local_d8 = BVH4OBBVirtualCurveIntersectorRobust8Hybrid_error;
  if (bVar19) {
    local_d8 = avx::BVH4OBBVirtualCurveIntersectorRobust8Hybrid;
  }
  local_e0 = BVH4OBBVirtualCurveIntersectorRobust8HybridMB_error;
  if (bVar19) {
    local_e0 = avx::BVH4OBBVirtualCurveIntersectorRobust8HybridMB;
  }
  local_e8 = BVH4Triangle4Intersector8HybridMoeller_error;
  if (bVar19) {
    local_e8 = avx::BVH4Triangle4Intersector8HybridMoeller;
  }
  local_f0 = BVH4Triangle4Intersector8HybridMoellerNoFilter_error;
  if (bVar19) {
    local_f0 = avx::BVH4Triangle4Intersector8HybridMoellerNoFilter;
  }
  local_f8 = BVH4Triangle4iIntersector8HybridMoeller_error;
  if (bVar19) {
    local_f8 = avx::BVH4Triangle4iIntersector8HybridMoeller;
  }
  local_100 = BVH4Triangle4vIntersector8HybridPluecker_error;
  if (bVar19) {
    local_100 = avx::BVH4Triangle4vIntersector8HybridPluecker;
  }
  local_108 = BVH4Triangle4iIntersector8HybridPluecker_error;
  if (bVar19) {
    local_108 = avx::BVH4Triangle4iIntersector8HybridPluecker;
  }
  local_110 = BVH4Triangle4vMBIntersector8HybridMoeller_error;
  if (bVar19) {
    local_110 = avx::BVH4Triangle4vMBIntersector8HybridMoeller;
  }
  local_118 = BVH4Triangle4iMBIntersector8HybridMoeller_error;
  if (bVar19) {
    local_118 = avx::BVH4Triangle4iMBIntersector8HybridMoeller;
  }
  local_120 = BVH4Triangle4vMBIntersector8HybridPluecker_error;
  if (bVar19) {
    local_120 = avx::BVH4Triangle4vMBIntersector8HybridPluecker;
  }
  local_128 = BVH4Triangle4iMBIntersector8HybridPluecker_error;
  if (bVar19) {
    local_128 = avx::BVH4Triangle4iMBIntersector8HybridPluecker;
  }
  local_130 = BVH4Quad4vIntersector8HybridMoeller_error;
  if (bVar19) {
    local_130 = avx::BVH4Quad4vIntersector8HybridMoeller;
  }
  local_138 = BVH4Quad4vIntersector8HybridMoellerNoFilter_error;
  if (bVar19) {
    local_138 = avx::BVH4Quad4vIntersector8HybridMoellerNoFilter;
  }
  local_140 = BVH4Quad4iIntersector8HybridMoeller_error;
  if (bVar19) {
    local_140 = avx::BVH4Quad4iIntersector8HybridMoeller;
  }
  local_148 = BVH4Quad4vIntersector8HybridPluecker_error;
  if (bVar19) {
    local_148 = avx::BVH4Quad4vIntersector8HybridPluecker;
  }
  local_150 = BVH4Quad4iIntersector8HybridPluecker_error;
  if (bVar19) {
    local_150 = avx::BVH4Quad4iIntersector8HybridPluecker;
  }
  local_158 = BVH4Quad4iMBIntersector8HybridMoeller_error;
  if (bVar19) {
    local_158 = avx::BVH4Quad4iMBIntersector8HybridMoeller;
  }
  local_160 = BVH4Quad4iMBIntersector8HybridPluecker_error;
  if (bVar19) {
    local_160 = avx::BVH4Quad4iMBIntersector8HybridPluecker;
  }
  local_168 = BVH4SubdivPatch1Intersector8_error;
  if (bVar19) {
    local_168 = avx::BVH4SubdivPatch1Intersector8;
  }
  local_170 = BVH4SubdivPatch1MBIntersector8_error;
  if (bVar19) {
    local_170 = avx::BVH4SubdivPatch1MBIntersector8;
  }
  local_178 = BVH4VirtualIntersector8Chunk_error;
  if (bVar19) {
    local_178 = avx::BVH4VirtualIntersector8Chunk;
  }
  local_190 = BVH4VirtualMBIntersector8Chunk_error;
  if (bVar19) {
    local_190 = avx::BVH4VirtualMBIntersector8Chunk;
  }
  local_198 = BVH4InstanceIntersector8Chunk_error;
  if (bVar19) {
    local_198 = avx::BVH4InstanceIntersector8Chunk;
  }
  local_1a0 = BVH4InstanceMBIntersector8Chunk_error;
  if (bVar19) {
    local_1a0 = avx::BVH4InstanceMBIntersector8Chunk;
  }
  local_1a8 = BVH4InstanceArrayIntersector8Chunk_error;
  if (bVar19) {
    local_1a8 = avx::BVH4InstanceArrayIntersector8Chunk;
  }
  local_1b0 = BVH4InstanceArrayMBIntersector8Chunk_error;
  if (bVar19) {
    local_1b0 = avx::BVH4InstanceArrayMBIntersector8Chunk;
  }
  pcVar17 = BVH4GridIntersector8HybridMoeller_error;
  if (bVar19) {
    pcVar17 = avx::BVH4GridIntersector8HybridMoeller;
  }
  pcVar10 = BVH4GridMBIntersector8HybridMoeller_error;
  if (bVar19) {
    pcVar10 = avx::BVH4GridMBIntersector8HybridMoeller;
  }
  local_180 = BVH4GridIntersector8HybridPluecker_error;
  if (bVar19) {
    local_180 = avx::BVH4GridIntersector8HybridPluecker;
  }
  if ((uVar13 & 0x6007dff) == 0) {
    pcVar14 = avx2::VirtualCurveIntersector4i;
    pcVar15 = avx2::VirtualCurveIntersector8i;
    local_188 = avx2::VirtualCurveIntersector4v;
    local_70 = avx2::VirtualCurveIntersector8v;
    local_78 = avx2::VirtualCurveIntersector4iMB;
    local_80 = avx2::VirtualCurveIntersector8iMB;
    local_88 = avx2::BVH4OBBVirtualCurveIntersector1;
    local_98 = avx2::BVH4OBBVirtualCurveIntersector1MB;
    local_a8 = avx2::BVH4OBBVirtualCurveIntersectorRobust1;
    local_b8 = avx2::BVH4OBBVirtualCurveIntersectorRobust1MB;
    local_c8 = avx2::BVH4Triangle4Intersector1Moeller;
    local_228 = avx2::BVH4Triangle4vMBIntersector1Moeller;
    local_218 = avx2::BVH4Triangle4iMBIntersector1Moeller;
    local_68 = avx2::BVH4Triangle4vMBIntersector1Pluecker;
    local_60 = avx2::BVH4Triangle4iMBIntersector1Pluecker;
    local_208 = avx2::BVH4Quad4vIntersector1Moeller;
    local_200 = avx2::BVH4Quad4iIntersector1Moeller;
    local_1f0 = avx2::BVH4Quad4vIntersector1Pluecker;
    local_1e0 = avx2::BVH4Quad4iIntersector1Pluecker;
    local_1d8 = avx2::BVH4Quad4iMBIntersector1Pluecker;
    local_1d0 = avx2::BVH4Quad4iMBIntersector1Moeller;
    local_298 = avx2::BVH4SubdivPatch1Intersector1;
    local_250 = avx2::BVH4SubdivPatch1MBIntersector1;
    local_1e8 = avx2::BVH4VirtualIntersector1;
    local_268 = avx2::BVH4VirtualMBIntersector1;
    local_1f8 = avx2::BVH4InstanceIntersector1;
    local_2b8 = avx2::BVH4InstanceMBIntersector1;
    local_278 = avx2::BVH4InstanceArrayIntersector1;
    local_220 = avx2::BVH4InstanceArrayMBIntersector1;
    local_230 = avx2::BVH4GridIntersector1Moeller;
    local_288 = avx2::BVH4GridMBIntersector1Moeller;
    local_2a0 = avx2::BVH4GridIntersector1Pluecker;
    local_90 = avx2::BVH4OBBVirtualCurveIntersector4Hybrid;
    local_a0 = avx2::BVH4OBBVirtualCurveIntersector4HybridMB;
    local_b0 = avx2::BVH4OBBVirtualCurveIntersectorRobust4Hybrid;
    local_c0 = avx2::BVH4OBBVirtualCurveIntersectorRobust4HybridMB;
    local_240 = avx2::BVH4Triangle4Intersector4HybridMoeller;
    local_260 = avx2::BVH4Triangle4Intersector4HybridMoellerNoFilter;
    local_210 = avx2::BVH4Triangle4iIntersector4HybridMoeller;
    pcVar4 = avx2::BVH4Triangle4vIntersector4HybridPluecker;
    local_2a8 = avx2::BVH4Triangle4iIntersector4HybridPluecker;
    local_238 = avx2::BVH4Triangle4vMBIntersector4HybridMoeller;
    local_248 = avx2::BVH4Triangle4iMBIntersector4HybridMoeller;
    local_258 = avx2::BVH4Triangle4vMBIntersector4HybridPluecker;
    local_2c0 = avx2::BVH4Triangle4iMBIntersector4HybridPluecker;
    local_1c8 = avx2::BVH4Quad4vIntersector4HybridMoeller;
    local_2b0 = avx2::BVH4Quad4vIntersector4HybridMoellerNoFilter;
    local_270 = avx2::BVH4Quad4iIntersector4HybridMoeller;
    local_280 = avx2::BVH4Quad4vIntersector4HybridPluecker;
    pcVar5 = avx2::BVH4Quad4iIntersector4HybridPluecker;
    local_290 = avx2::BVH4Quad4iMBIntersector4HybridMoeller;
    pcVar6 = avx2::BVH4Quad4iMBIntersector4HybridPluecker;
    local_2c8 = avx2::BVH4SubdivPatch1Intersector4;
    pcVar7 = avx2::BVH4SubdivPatch1MBIntersector4;
    local_2d0 = avx2::BVH4VirtualIntersector4Chunk;
    pcVar8 = avx2::BVH4VirtualMBIntersector4Chunk;
    local_2d8 = avx2::BVH4InstanceIntersector4Chunk;
    pcVar9 = avx2::BVH4InstanceMBIntersector4Chunk;
    local_2e0 = avx2::BVH4InstanceArrayIntersector4Chunk;
    local_2f0 = avx2::BVH4InstanceArrayMBIntersector4Chunk;
    local_2e8 = avx2::BVH4GridIntersector4HybridMoeller;
    pcVar18 = avx2::BVH4GridMBIntersector4HybridMoeller;
    local_2f8 = avx2::BVH4GridIntersector4HybridPluecker;
    pcVar1 = avx2::BVH4OBBVirtualCurveIntersector8Hybrid;
    local_d0 = avx2::BVH4OBBVirtualCurveIntersector8HybridMB;
    local_d8 = avx2::BVH4OBBVirtualCurveIntersectorRobust8Hybrid;
    local_e0 = avx2::BVH4OBBVirtualCurveIntersectorRobust8HybridMB;
    local_e8 = avx2::BVH4Triangle4Intersector8HybridMoeller;
    local_f0 = avx2::BVH4Triangle4Intersector8HybridMoellerNoFilter;
    local_f8 = avx2::BVH4Triangle4iIntersector8HybridMoeller;
    local_100 = avx2::BVH4Triangle4vIntersector8HybridPluecker;
    local_108 = avx2::BVH4Triangle4iIntersector8HybridPluecker;
    local_110 = avx2::BVH4Triangle4vMBIntersector8HybridMoeller;
    local_118 = avx2::BVH4Triangle4iMBIntersector8HybridMoeller;
    local_120 = avx2::BVH4Triangle4vMBIntersector8HybridPluecker;
    local_128 = avx2::BVH4Triangle4iMBIntersector8HybridPluecker;
    local_130 = avx2::BVH4Quad4vIntersector8HybridMoeller;
    local_138 = avx2::BVH4Quad4vIntersector8HybridMoellerNoFilter;
    local_140 = avx2::BVH4Quad4iIntersector8HybridMoeller;
    local_148 = avx2::BVH4Quad4vIntersector8HybridPluecker;
    local_150 = avx2::BVH4Quad4iIntersector8HybridPluecker;
    local_158 = avx2::BVH4Quad4iMBIntersector8HybridMoeller;
    local_160 = avx2::BVH4Quad4iMBIntersector8HybridPluecker;
    local_168 = avx2::BVH4SubdivPatch1Intersector8;
    local_170 = avx2::BVH4SubdivPatch1MBIntersector8;
    local_178 = avx2::BVH4VirtualIntersector8Chunk;
    local_190 = avx2::BVH4VirtualMBIntersector8Chunk;
    local_198 = avx2::BVH4InstanceIntersector8Chunk;
    local_1a0 = avx2::BVH4InstanceMBIntersector8Chunk;
    local_1a8 = avx2::BVH4InstanceArrayIntersector8Chunk;
    local_1b0 = avx2::BVH4InstanceArrayMBIntersector8Chunk;
    pcVar17 = avx2::BVH4GridIntersector8HybridMoeller;
    pcVar10 = avx2::BVH4GridMBIntersector8HybridMoeller;
    local_180 = avx2::BVH4GridIntersector8HybridPluecker;
  }
  bVar19 = (uVar13 & 0xe737dff) == 0;
  if (bVar19) {
    pcVar14 = avx512::VirtualCurveIntersector4i;
  }
  this->VirtualCurveIntersector4i = pcVar14;
  if (bVar19) {
    pcVar15 = avx512::VirtualCurveIntersector8i;
  }
  this->VirtualCurveIntersector8i = pcVar15;
  if (bVar19) {
    local_188 = avx512::VirtualCurveIntersector4v;
  }
  this->VirtualCurveIntersector4v = local_188;
  if (bVar19) {
    local_70 = avx512::VirtualCurveIntersector8v;
  }
  this->VirtualCurveIntersector8v = local_70;
  if (bVar19) {
    local_78 = avx512::VirtualCurveIntersector4iMB;
  }
  this->VirtualCurveIntersector4iMB = local_78;
  if (bVar19) {
    local_80 = avx512::VirtualCurveIntersector8iMB;
  }
  this->VirtualCurveIntersector8iMB = local_80;
  if (bVar19) {
    local_88 = avx512::BVH4OBBVirtualCurveIntersector1;
  }
  this->BVH4OBBVirtualCurveIntersector1 = local_88;
  if (bVar19) {
    local_98 = avx512::BVH4OBBVirtualCurveIntersector1MB;
  }
  this->BVH4OBBVirtualCurveIntersector1MB = local_98;
  if (bVar19) {
    local_a8 = avx512::BVH4OBBVirtualCurveIntersectorRobust1;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust1 = local_a8;
  if (bVar19) {
    local_b8 = avx512::BVH4OBBVirtualCurveIntersectorRobust1MB;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust1MB = local_b8;
  if (bVar19) {
    local_c8 = avx512::BVH4Triangle4Intersector1Moeller;
  }
  this->BVH4Triangle4Intersector1Moeller = local_c8;
  if (bVar19) {
    pcVar16 = avx512::BVH4Triangle4iIntersector1Moeller;
  }
  this->BVH4Triangle4iIntersector1Moeller = pcVar16;
  if (bVar19) {
    pcVar12 = avx512::BVH4Triangle4vIntersector1Pluecker;
  }
  this->BVH4Triangle4vIntersector1Pluecker = pcVar12;
  if (bVar19) {
    pcVar11 = avx512::BVH4Triangle4iIntersector1Pluecker;
  }
  this->BVH4Triangle4iIntersector1Pluecker = pcVar11;
  if (bVar19) {
    local_228 = avx512::BVH4Triangle4vMBIntersector1Moeller;
  }
  this->BVH4Triangle4vMBIntersector1Moeller = local_228;
  if (bVar19) {
    local_218 = avx512::BVH4Triangle4iMBIntersector1Moeller;
  }
  this->BVH4Triangle4iMBIntersector1Moeller = local_218;
  if (bVar19) {
    local_68 = avx512::BVH4Triangle4vMBIntersector1Pluecker;
  }
  this->BVH4Triangle4vMBIntersector1Pluecker = local_68;
  if (bVar19) {
    local_60 = avx512::BVH4Triangle4iMBIntersector1Pluecker;
  }
  this->BVH4Triangle4iMBIntersector1Pluecker = local_60;
  if (bVar19) {
    local_208 = avx512::BVH4Quad4vIntersector1Moeller;
  }
  this->BVH4Quad4vIntersector1Moeller = local_208;
  if (bVar19) {
    local_200 = avx512::BVH4Quad4iIntersector1Moeller;
  }
  this->BVH4Quad4iIntersector1Moeller = local_200;
  if (bVar19) {
    local_1f0 = avx512::BVH4Quad4vIntersector1Pluecker;
  }
  this->BVH4Quad4vIntersector1Pluecker = local_1f0;
  if (bVar19) {
    local_1e0 = avx512::BVH4Quad4iIntersector1Pluecker;
  }
  this->BVH4Quad4iIntersector1Pluecker = local_1e0;
  if (bVar19) {
    local_1d8 = avx512::BVH4Quad4iMBIntersector1Pluecker;
  }
  this->BVH4Quad4iMBIntersector1Pluecker = local_1d8;
  if (bVar19) {
    local_1d0 = avx512::BVH4Quad4iMBIntersector1Moeller;
  }
  this->BVH4Quad4iMBIntersector1Moeller = local_1d0;
  if (bVar19) {
    pcVar2 = avx512::QBVH4Triangle4iIntersector1Pluecker;
  }
  this->QBVH4Triangle4iIntersector1Pluecker = pcVar2;
  if (bVar19) {
    pcVar3 = avx512::QBVH4Quad4iIntersector1Pluecker;
  }
  this->QBVH4Quad4iIntersector1Pluecker = pcVar3;
  if (bVar19) {
    local_298 = avx512::BVH4SubdivPatch1Intersector1;
  }
  this->BVH4SubdivPatch1Intersector1 = local_298;
  if (bVar19) {
    local_250 = avx512::BVH4SubdivPatch1MBIntersector1;
  }
  this->BVH4SubdivPatch1MBIntersector1 = local_250;
  if (bVar19) {
    local_1e8 = avx512::BVH4VirtualIntersector1;
  }
  this->BVH4VirtualIntersector1 = local_1e8;
  if (bVar19) {
    local_268 = avx512::BVH4VirtualMBIntersector1;
  }
  this->BVH4VirtualMBIntersector1 = local_268;
  if (bVar19) {
    local_1f8 = avx512::BVH4InstanceIntersector1;
  }
  this->BVH4InstanceIntersector1 = local_1f8;
  if (bVar19) {
    local_2b8 = avx512::BVH4InstanceMBIntersector1;
  }
  this->BVH4InstanceMBIntersector1 = local_2b8;
  if (bVar19) {
    local_278 = avx512::BVH4InstanceArrayIntersector1;
  }
  this->BVH4InstanceArrayIntersector1 = local_278;
  if (bVar19) {
    local_220 = avx512::BVH4InstanceArrayMBIntersector1;
  }
  this->BVH4InstanceArrayMBIntersector1 = local_220;
  if (bVar19) {
    local_230 = avx512::BVH4GridIntersector1Moeller;
  }
  this->BVH4GridIntersector1Moeller = local_230;
  if (bVar19) {
    local_288 = avx512::BVH4GridMBIntersector1Moeller;
  }
  this->BVH4GridMBIntersector1Moeller = local_288;
  if (bVar19) {
    local_2a0 = avx512::BVH4GridIntersector1Pluecker;
  }
  this->BVH4GridIntersector1Pluecker = local_2a0;
  if (bVar19) {
    local_90 = avx512::BVH4OBBVirtualCurveIntersector4Hybrid;
  }
  this->BVH4OBBVirtualCurveIntersector4Hybrid = local_90;
  if (bVar19) {
    local_a0 = avx512::BVH4OBBVirtualCurveIntersector4HybridMB;
  }
  this->BVH4OBBVirtualCurveIntersector4HybridMB = local_a0;
  if (bVar19) {
    local_b0 = avx512::BVH4OBBVirtualCurveIntersectorRobust4Hybrid;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust4Hybrid = local_b0;
  if (bVar19) {
    local_c0 = avx512::BVH4OBBVirtualCurveIntersectorRobust4HybridMB;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust4HybridMB = local_c0;
  if (bVar19) {
    local_240 = avx512::BVH4Triangle4Intersector4HybridMoeller;
  }
  this->BVH4Triangle4Intersector4HybridMoeller = local_240;
  if (bVar19) {
    local_260 = avx512::BVH4Triangle4Intersector4HybridMoellerNoFilter;
  }
  this->BVH4Triangle4Intersector4HybridMoellerNoFilter = local_260;
  if (bVar19) {
    local_210 = avx512::BVH4Triangle4iIntersector4HybridMoeller;
  }
  this->BVH4Triangle4iIntersector4HybridMoeller = local_210;
  if (bVar19) {
    pcVar4 = avx512::BVH4Triangle4vIntersector4HybridPluecker;
  }
  this->BVH4Triangle4vIntersector4HybridPluecker = pcVar4;
  if (bVar19) {
    local_2a8 = avx512::BVH4Triangle4iIntersector4HybridPluecker;
  }
  this->BVH4Triangle4iIntersector4HybridPluecker = local_2a8;
  if (bVar19) {
    local_238 = avx512::BVH4Triangle4vMBIntersector4HybridMoeller;
  }
  this->BVH4Triangle4vMBIntersector4HybridMoeller = local_238;
  if (bVar19) {
    local_248 = avx512::BVH4Triangle4iMBIntersector4HybridMoeller;
  }
  this->BVH4Triangle4iMBIntersector4HybridMoeller = local_248;
  if (bVar19) {
    local_258 = avx512::BVH4Triangle4vMBIntersector4HybridPluecker;
  }
  this->BVH4Triangle4vMBIntersector4HybridPluecker = local_258;
  if (bVar19) {
    local_2c0 = avx512::BVH4Triangle4iMBIntersector4HybridPluecker;
  }
  this->BVH4Triangle4iMBIntersector4HybridPluecker = local_2c0;
  if (bVar19) {
    local_2b0 = avx512::BVH4Quad4vIntersector4HybridMoellerNoFilter;
  }
  this->BVH4Quad4vIntersector4HybridMoellerNoFilter = local_2b0;
  if (bVar19) {
    local_270 = avx512::BVH4Quad4iIntersector4HybridMoeller;
  }
  this->BVH4Quad4iIntersector4HybridMoeller = local_270;
  if (bVar19) {
    local_280 = avx512::BVH4Quad4vIntersector4HybridPluecker;
  }
  this->BVH4Quad4vIntersector4HybridPluecker = local_280;
  if (bVar19) {
    pcVar5 = avx512::BVH4Quad4iIntersector4HybridPluecker;
  }
  this->BVH4Quad4iIntersector4HybridPluecker = pcVar5;
  if (bVar19) {
    local_290 = avx512::BVH4Quad4iMBIntersector4HybridMoeller;
  }
  this->BVH4Quad4iMBIntersector4HybridMoeller = local_290;
  if (bVar19) {
    pcVar6 = avx512::BVH4Quad4iMBIntersector4HybridPluecker;
  }
  this->BVH4Quad4iMBIntersector4HybridPluecker = pcVar6;
  if (bVar19) {
    local_2c8 = avx512::BVH4SubdivPatch1Intersector4;
  }
  this->BVH4SubdivPatch1Intersector4 = local_2c8;
  if (bVar19) {
    pcVar7 = avx512::BVH4SubdivPatch1MBIntersector4;
  }
  this->BVH4SubdivPatch1MBIntersector4 = pcVar7;
  if (bVar19) {
    local_2d0 = avx512::BVH4VirtualIntersector4Chunk;
  }
  this->BVH4VirtualIntersector4Chunk = local_2d0;
  if (bVar19) {
    pcVar8 = avx512::BVH4VirtualMBIntersector4Chunk;
  }
  this->BVH4VirtualMBIntersector4Chunk = pcVar8;
  if (bVar19) {
    local_2d8 = avx512::BVH4InstanceIntersector4Chunk;
  }
  this->BVH4InstanceIntersector4Chunk = local_2d8;
  if (bVar19) {
    pcVar9 = avx512::BVH4InstanceMBIntersector4Chunk;
  }
  this->BVH4InstanceMBIntersector4Chunk = pcVar9;
  if (bVar19) {
    local_2e0 = avx512::BVH4InstanceArrayIntersector4Chunk;
  }
  this->BVH4InstanceArrayIntersector4Chunk = local_2e0;
  if (bVar19) {
    local_2f0 = avx512::BVH4InstanceArrayMBIntersector4Chunk;
  }
  this->BVH4InstanceArrayMBIntersector4Chunk = local_2f0;
  if (bVar19) {
    local_1c8 = avx512::BVH4Quad4vIntersector4HybridMoeller;
  }
  this->BVH4Quad4vIntersector4HybridMoeller = local_1c8;
  if (bVar19) {
    local_2e8 = avx512::BVH4GridIntersector4HybridMoeller;
  }
  this->BVH4GridIntersector4HybridMoeller = local_2e8;
  if (bVar19) {
    pcVar18 = avx512::BVH4GridMBIntersector4HybridMoeller;
  }
  this->BVH4GridMBIntersector4HybridMoeller = pcVar18;
  if (bVar19) {
    local_2f8 = avx512::BVH4GridIntersector4HybridPluecker;
  }
  this->BVH4GridIntersector4HybridPluecker = local_2f8;
  if (bVar19) {
    pcVar1 = avx512::BVH4OBBVirtualCurveIntersector8Hybrid;
  }
  this->BVH4OBBVirtualCurveIntersector8Hybrid = pcVar1;
  if (bVar19) {
    local_d0 = avx512::BVH4OBBVirtualCurveIntersector8HybridMB;
  }
  this->BVH4OBBVirtualCurveIntersector8HybridMB = local_d0;
  if (bVar19) {
    local_d8 = avx512::BVH4OBBVirtualCurveIntersectorRobust8Hybrid;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust8Hybrid = local_d8;
  if (bVar19) {
    local_e0 = avx512::BVH4OBBVirtualCurveIntersectorRobust8HybridMB;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust8HybridMB = local_e0;
  if (bVar19) {
    local_e8 = avx512::BVH4Triangle4Intersector8HybridMoeller;
  }
  this->BVH4Triangle4Intersector8HybridMoeller = local_e8;
  if (bVar19) {
    local_f0 = avx512::BVH4Triangle4Intersector8HybridMoellerNoFilter;
  }
  this->BVH4Triangle4Intersector8HybridMoellerNoFilter = local_f0;
  if (bVar19) {
    local_f8 = avx512::BVH4Triangle4iIntersector8HybridMoeller;
  }
  this->BVH4Triangle4iIntersector8HybridMoeller = local_f8;
  if (bVar19) {
    local_100 = avx512::BVH4Triangle4vIntersector8HybridPluecker;
  }
  this->BVH4Triangle4vIntersector8HybridPluecker = local_100;
  if (bVar19) {
    local_108 = avx512::BVH4Triangle4iIntersector8HybridPluecker;
  }
  this->BVH4Triangle4iIntersector8HybridPluecker = local_108;
  if (bVar19) {
    local_110 = avx512::BVH4Triangle4vMBIntersector8HybridMoeller;
  }
  this->BVH4Triangle4vMBIntersector8HybridMoeller = local_110;
  if (bVar19) {
    local_118 = avx512::BVH4Triangle4iMBIntersector8HybridMoeller;
  }
  this->BVH4Triangle4iMBIntersector8HybridMoeller = local_118;
  if (bVar19) {
    local_120 = avx512::BVH4Triangle4vMBIntersector8HybridPluecker;
  }
  this->BVH4Triangle4vMBIntersector8HybridPluecker = local_120;
  if (bVar19) {
    local_128 = avx512::BVH4Triangle4iMBIntersector8HybridPluecker;
  }
  this->BVH4Triangle4iMBIntersector8HybridPluecker = local_128;
  if (bVar19) {
    local_130 = avx512::BVH4Quad4vIntersector8HybridMoeller;
  }
  this->BVH4Quad4vIntersector8HybridMoeller = local_130;
  if (bVar19) {
    local_138 = avx512::BVH4Quad4vIntersector8HybridMoellerNoFilter;
  }
  this->BVH4Quad4vIntersector8HybridMoellerNoFilter = local_138;
  if (bVar19) {
    local_140 = avx512::BVH4Quad4iIntersector8HybridMoeller;
  }
  this->BVH4Quad4iIntersector8HybridMoeller = local_140;
  if (bVar19) {
    local_148 = avx512::BVH4Quad4vIntersector8HybridPluecker;
  }
  this->BVH4Quad4vIntersector8HybridPluecker = local_148;
  if (bVar19) {
    local_150 = avx512::BVH4Quad4iIntersector8HybridPluecker;
  }
  this->BVH4Quad4iIntersector8HybridPluecker = local_150;
  if (bVar19) {
    local_158 = avx512::BVH4Quad4iMBIntersector8HybridMoeller;
  }
  this->BVH4Quad4iMBIntersector8HybridMoeller = local_158;
  if (bVar19) {
    local_160 = avx512::BVH4Quad4iMBIntersector8HybridPluecker;
  }
  this->BVH4Quad4iMBIntersector8HybridPluecker = local_160;
  if (bVar19) {
    local_168 = avx512::BVH4SubdivPatch1Intersector8;
  }
  this->BVH4SubdivPatch1Intersector8 = local_168;
  if (bVar19) {
    local_170 = avx512::BVH4SubdivPatch1MBIntersector8;
  }
  this->BVH4SubdivPatch1MBIntersector8 = local_170;
  if (bVar19) {
    local_178 = avx512::BVH4VirtualIntersector8Chunk;
  }
  this->BVH4VirtualIntersector8Chunk = local_178;
  if (bVar19) {
    local_190 = avx512::BVH4VirtualMBIntersector8Chunk;
  }
  this->BVH4VirtualMBIntersector8Chunk = local_190;
  if (bVar19) {
    local_198 = avx512::BVH4InstanceIntersector8Chunk;
  }
  this->BVH4InstanceIntersector8Chunk = local_198;
  if (bVar19) {
    local_1a0 = avx512::BVH4InstanceMBIntersector8Chunk;
  }
  this->BVH4InstanceMBIntersector8Chunk = local_1a0;
  if (bVar19) {
    local_1a8 = avx512::BVH4InstanceArrayIntersector8Chunk;
  }
  this->BVH4InstanceArrayIntersector8Chunk = local_1a8;
  if (bVar19) {
    local_1b0 = avx512::BVH4InstanceArrayMBIntersector8Chunk;
  }
  this->BVH4InstanceArrayMBIntersector8Chunk = local_1b0;
  if (bVar19) {
    pcVar17 = avx512::BVH4GridIntersector8HybridMoeller;
  }
  this->BVH4GridIntersector8HybridMoeller = pcVar17;
  if (bVar19) {
    pcVar10 = avx512::BVH4GridMBIntersector8HybridMoeller;
  }
  this->BVH4GridMBIntersector8HybridMoeller = pcVar10;
  if (bVar19) {
    local_180 = avx512::BVH4GridIntersector8HybridPluecker;
  }
  pcVar16 = BVH4OBBVirtualCurveIntersector16Hybrid_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4OBBVirtualCurveIntersector16Hybrid;
  }
  pcVar12 = BVH4OBBVirtualCurveIntersector16HybridMB_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4OBBVirtualCurveIntersector16HybridMB;
  }
  this->BVH4GridIntersector8HybridPluecker = local_180;
  this->BVH4OBBVirtualCurveIntersector16Hybrid = pcVar16;
  this->BVH4OBBVirtualCurveIntersector16HybridMB = pcVar12;
  pcVar16 = BVH4OBBVirtualCurveIntersectorRobust16Hybrid_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4OBBVirtualCurveIntersectorRobust16Hybrid;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust16Hybrid = pcVar16;
  pcVar16 = BVH4OBBVirtualCurveIntersectorRobust16HybridMB_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4OBBVirtualCurveIntersectorRobust16HybridMB;
  }
  pcVar12 = BVH4Triangle4Intersector16HybridMoeller_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4Triangle4Intersector16HybridMoeller;
  }
  pcVar11 = BVH4Triangle4Intersector16HybridMoellerNoFilter_error;
  if (bVar19) {
    pcVar11 = avx512::BVH4Triangle4Intersector16HybridMoellerNoFilter;
  }
  this->BVH4OBBVirtualCurveIntersectorRobust16HybridMB = pcVar16;
  this->BVH4Triangle4Intersector16HybridMoeller = pcVar12;
  this->BVH4Triangle4Intersector16HybridMoellerNoFilter = pcVar11;
  pcVar16 = BVH4Triangle4iIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Triangle4iIntersector16HybridMoeller;
  }
  this->BVH4Triangle4iIntersector16HybridMoeller = pcVar16;
  pcVar16 = BVH4Triangle4vIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Triangle4vIntersector16HybridPluecker;
  }
  pcVar12 = BVH4Triangle4iIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4Triangle4iIntersector16HybridPluecker;
  }
  pcVar11 = BVH4Triangle4vMBIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar11 = avx512::BVH4Triangle4vMBIntersector16HybridMoeller;
  }
  this->BVH4Triangle4vIntersector16HybridPluecker = pcVar16;
  this->BVH4Triangle4iIntersector16HybridPluecker = pcVar12;
  this->BVH4Triangle4vMBIntersector16HybridMoeller = pcVar11;
  pcVar16 = BVH4Triangle4iMBIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Triangle4iMBIntersector16HybridMoeller;
  }
  this->BVH4Triangle4iMBIntersector16HybridMoeller = pcVar16;
  pcVar16 = BVH4Triangle4vMBIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Triangle4vMBIntersector16HybridPluecker;
  }
  pcVar12 = BVH4Triangle4iMBIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4Triangle4iMBIntersector16HybridPluecker;
  }
  pcVar11 = BVH4Quad4vIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar11 = avx512::BVH4Quad4vIntersector16HybridMoeller;
  }
  this->BVH4Triangle4vMBIntersector16HybridPluecker = pcVar16;
  this->BVH4Triangle4iMBIntersector16HybridPluecker = pcVar12;
  this->BVH4Quad4vIntersector16HybridMoeller = pcVar11;
  pcVar16 = BVH4Quad4vIntersector16HybridMoellerNoFilter_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Quad4vIntersector16HybridMoellerNoFilter;
  }
  this->BVH4Quad4vIntersector16HybridMoellerNoFilter = pcVar16;
  pcVar16 = BVH4Quad4iIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Quad4iIntersector16HybridMoeller;
  }
  pcVar12 = BVH4Quad4vIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4Quad4vIntersector16HybridPluecker;
  }
  pcVar11 = BVH4Quad4iIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar11 = avx512::BVH4Quad4iIntersector16HybridPluecker;
  }
  this->BVH4Quad4iIntersector16HybridMoeller = pcVar16;
  this->BVH4Quad4vIntersector16HybridPluecker = pcVar12;
  this->BVH4Quad4iIntersector16HybridPluecker = pcVar11;
  pcVar16 = BVH4Quad4iMBIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Quad4iMBIntersector16HybridMoeller;
  }
  this->BVH4Quad4iMBIntersector16HybridMoeller = pcVar16;
  pcVar16 = BVH4Quad4iMBIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4Quad4iMBIntersector16HybridPluecker;
  }
  pcVar12 = BVH4SubdivPatch1Intersector16_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4SubdivPatch1Intersector16;
  }
  pcVar11 = BVH4SubdivPatch1MBIntersector16_error;
  if (bVar19) {
    pcVar11 = avx512::BVH4SubdivPatch1MBIntersector16;
  }
  this->BVH4Quad4iMBIntersector16HybridPluecker = pcVar16;
  this->BVH4SubdivPatch1Intersector16 = pcVar12;
  this->BVH4SubdivPatch1MBIntersector16 = pcVar11;
  pcVar16 = BVH4VirtualIntersector16Chunk_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4VirtualIntersector16Chunk;
  }
  this->BVH4VirtualIntersector16Chunk = pcVar16;
  pcVar16 = BVH4VirtualMBIntersector16Chunk_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4VirtualMBIntersector16Chunk;
  }
  pcVar12 = BVH4InstanceIntersector16Chunk_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4InstanceIntersector16Chunk;
  }
  pcVar11 = BVH4InstanceMBIntersector16Chunk_error;
  if (bVar19) {
    pcVar11 = avx512::BVH4InstanceMBIntersector16Chunk;
  }
  this->BVH4VirtualMBIntersector16Chunk = pcVar16;
  this->BVH4InstanceIntersector16Chunk = pcVar12;
  this->BVH4InstanceMBIntersector16Chunk = pcVar11;
  pcVar16 = BVH4InstanceArrayIntersector16Chunk_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4InstanceArrayIntersector16Chunk;
  }
  this->BVH4InstanceArrayIntersector16Chunk = pcVar16;
  pcVar16 = BVH4InstanceArrayMBIntersector16Chunk_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4InstanceArrayMBIntersector16Chunk;
  }
  pcVar12 = BVH4GridIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar12 = avx512::BVH4GridIntersector16HybridMoeller;
  }
  pcVar11 = BVH4GridMBIntersector16HybridMoeller_error;
  if (bVar19) {
    pcVar11 = avx512::BVH4GridMBIntersector16HybridMoeller;
  }
  this->BVH4InstanceArrayMBIntersector16Chunk = pcVar16;
  this->BVH4GridIntersector16HybridMoeller = pcVar12;
  this->BVH4GridMBIntersector16HybridMoeller = pcVar11;
  pcVar16 = BVH4GridIntersector16HybridPluecker_error;
  if (bVar19) {
    pcVar16 = avx512::BVH4GridIntersector16HybridPluecker;
  }
  this->BVH4GridIntersector16HybridPluecker = pcVar16;
  return;
}

Assistant:

void BVH4Factory::selectIntersectors(int features)
  {
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,VirtualCurveIntersector4i));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,VirtualCurveIntersector8i));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,VirtualCurveIntersector4v));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,VirtualCurveIntersector8v));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,VirtualCurveIntersector4iMB));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,VirtualCurveIntersector8iMB));
    
    /* select intersectors1 */
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersector1));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersector1MB));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust1));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust1MB));
    
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4Triangle4Intersector1Moeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX512(features,BVH4Triangle4iIntersector1Moeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX512(features,BVH4Triangle4vIntersector1Pluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX512(features,BVH4Triangle4iIntersector1Pluecker));

    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4vMBIntersector1Moeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4iMBIntersector1Moeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4vMBIntersector1Pluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4iMBIntersector1Pluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector1Moeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iIntersector1Moeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector1Pluecker));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iIntersector1Pluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iMBIntersector1Pluecker));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iMBIntersector1Moeller));

    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX512(features,QBVH4Triangle4iIntersector1Pluecker));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX512(features,QBVH4Quad4iIntersector1Pluecker));

    IF_ENABLED_SUBDIV(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4SubdivPatch1Intersector1));
    IF_ENABLED_SUBDIV(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4SubdivPatch1MBIntersector1));
    
    IF_ENABLED_USER(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4VirtualIntersector1));
    IF_ENABLED_USER(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4VirtualMBIntersector1));

    IF_ENABLED_INSTANCE(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceIntersector1));
    IF_ENABLED_INSTANCE(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceMBIntersector1));

    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceArrayIntersector1));
    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceArrayMBIntersector1));

    IF_ENABLED_GRIDS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4GridIntersector1Moeller));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4GridMBIntersector1Moeller))
    IF_ENABLED_GRIDS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4GridIntersector1Pluecker));

#if defined (EMBREE_RAY_PACKETS)

    /* select intersectors4 */
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersector4Hybrid));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersector4HybridMB));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust4Hybrid));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_DEFAULT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust4HybridMB));

    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4Intersector4HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4Intersector4HybridMoellerNoFilter));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4iIntersector4HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4vIntersector4HybridPluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4iIntersector4HybridPluecker));

    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4vMBIntersector4HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4iMBIntersector4HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4vMBIntersector4HybridPluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Triangle4iMBIntersector4HybridPluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector4HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector4HybridMoellerNoFilter));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iIntersector4HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector4HybridPluecker));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iIntersector4HybridPluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iMBIntersector4HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4iMBIntersector4HybridPluecker));

    IF_ENABLED_SUBDIV(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4SubdivPatch1Intersector4));
    IF_ENABLED_SUBDIV(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4SubdivPatch1MBIntersector4));
    
    IF_ENABLED_USER(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4VirtualIntersector4Chunk));
    IF_ENABLED_USER(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4VirtualMBIntersector4Chunk));

    IF_ENABLED_INSTANCE(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceIntersector4Chunk));
    IF_ENABLED_INSTANCE(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceMBIntersector4Chunk));

    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceArrayIntersector4Chunk));
    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4InstanceArrayMBIntersector4Chunk));

    IF_ENABLED_QUADS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector4HybridMoeller));

    IF_ENABLED_GRIDS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4GridIntersector4HybridMoeller));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4GridMBIntersector4HybridMoeller));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_DEFAULT_SSE42_AVX_AVX2_AVX512(features,BVH4GridIntersector4HybridPluecker));

    /* select intersectors8 */
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersector8Hybrid));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersector8HybridMB));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust8Hybrid));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust8HybridMB));

    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4Intersector8HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4Intersector8HybridMoellerNoFilter));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4iIntersector8HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4vIntersector8HybridPluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4iIntersector8HybridPluecker));

    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4vMBIntersector8HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4iMBIntersector8HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4vMBIntersector8HybridPluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Triangle4iMBIntersector8HybridPluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector8HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector8HybridMoellerNoFilter));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Quad4iIntersector8HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Quad4vIntersector8HybridPluecker));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Quad4iIntersector8HybridPluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Quad4iMBIntersector8HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4Quad4iMBIntersector8HybridPluecker));

    IF_ENABLED_SUBDIV(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4SubdivPatch1Intersector8));
    IF_ENABLED_SUBDIV(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4SubdivPatch1MBIntersector8));

    IF_ENABLED_USER(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4VirtualIntersector8Chunk));
    IF_ENABLED_USER(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4VirtualMBIntersector8Chunk));

    IF_ENABLED_INSTANCE(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4InstanceIntersector8Chunk));
    IF_ENABLED_INSTANCE(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4InstanceMBIntersector8Chunk));

    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4InstanceArrayIntersector8Chunk));
    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4InstanceArrayMBIntersector8Chunk));

    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4GridIntersector8HybridMoeller));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4GridMBIntersector8HybridMoeller));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX_AVX2_AVX512(features,BVH4GridIntersector8HybridPluecker));

    /* select intersectors16 */
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX512(features,BVH4OBBVirtualCurveIntersector16Hybrid));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX512(features,BVH4OBBVirtualCurveIntersector16HybridMB));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust16Hybrid));
    IF_ENABLED_CURVES_OR_POINTS(SELECT_SYMBOL_INIT_AVX512(features,BVH4OBBVirtualCurveIntersectorRobust16HybridMB));

    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4Intersector16HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4Intersector16HybridMoellerNoFilter));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4iIntersector16HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4vIntersector16HybridPluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4iIntersector16HybridPluecker));

    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4vMBIntersector16HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4iMBIntersector16HybridMoeller));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4vMBIntersector16HybridPluecker));
    IF_ENABLED_TRIS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Triangle4iMBIntersector16HybridPluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Quad4vIntersector16HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Quad4vIntersector16HybridMoellerNoFilter));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Quad4iIntersector16HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Quad4vIntersector16HybridPluecker));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Quad4iIntersector16HybridPluecker));

    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Quad4iMBIntersector16HybridMoeller));
    IF_ENABLED_QUADS(SELECT_SYMBOL_INIT_AVX512(features,BVH4Quad4iMBIntersector16HybridPluecker));

    IF_ENABLED_SUBDIV(SELECT_SYMBOL_INIT_AVX512(features,BVH4SubdivPatch1Intersector16));
    IF_ENABLED_SUBDIV(SELECT_SYMBOL_INIT_AVX512(features,BVH4SubdivPatch1MBIntersector16));
    
    IF_ENABLED_USER(SELECT_SYMBOL_INIT_AVX512(features,BVH4VirtualIntersector16Chunk));
    IF_ENABLED_USER(SELECT_SYMBOL_INIT_AVX512(features,BVH4VirtualMBIntersector16Chunk));

    IF_ENABLED_INSTANCE(SELECT_SYMBOL_INIT_AVX512(features,BVH4InstanceIntersector16Chunk));
    IF_ENABLED_INSTANCE(SELECT_SYMBOL_INIT_AVX512(features,BVH4InstanceMBIntersector16Chunk));

    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_INIT_AVX512(features,BVH4InstanceArrayIntersector16Chunk));
    IF_ENABLED_INSTANCE_ARRAY(SELECT_SYMBOL_INIT_AVX512(features,BVH4InstanceArrayMBIntersector16Chunk));

    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX512(features,BVH4GridIntersector16HybridMoeller));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX512(features,BVH4GridMBIntersector16HybridMoeller));
    IF_ENABLED_GRIDS(SELECT_SYMBOL_INIT_AVX512(features,BVH4GridIntersector16HybridPluecker));

#endif
  }